

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O1

void rb_insert_fixup(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  uintptr_t *puVar1;
  lgx_rb_node_t *plVar2;
  bool bVar3;
  lgx_rb_node_t *plVar4;
  lgx_rb_node_s *plVar5;
  lgx_rb_node_s *plVar6;
  ulong *puVar7;
  lgx_rb_t *plVar8;
  lgx_rb_node_s *plVar9;
  lgx_rb_node_t *temp;
  lgx_rb_node_t *uncle;
  lgx_rb_t *plVar10;
  
LAB_001115d4:
  do {
    plVar5 = (lgx_rb_node_s *)(node->parent_color & 0xfffffffffffffffc);
    if ((plVar5 == (lgx_rb_node_s *)0x0) || ((plVar5->parent_color & 1) != 0)) {
      puVar1 = &rbt->root->parent_color;
      *puVar1 = *puVar1 | 1;
      return;
    }
    plVar4 = (lgx_rb_node_t *)(plVar5->parent_color & 0xfffffffffffffffc);
    plVar6 = plVar4->left;
    if (plVar6 == plVar5) goto LAB_00111704;
    bVar3 = true;
    if ((plVar6 != (lgx_rb_node_s *)0x0) && ((plVar6->parent_color & 1) == 0)) {
      plVar6->parent_color = plVar6->parent_color | 1;
      *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color | 1;
      *(byte *)&plVar4->parent_color = (byte)plVar4->parent_color & 0xfe;
      bVar3 = false;
      node = plVar4;
    }
  } while (!bVar3);
  plVar2 = plVar5->left;
  plVar6 = plVar5;
  if (plVar2 == node) {
    plVar6 = plVar2->right;
    plVar5->left = plVar6;
    if (plVar6 != (lgx_rb_node_s *)0x0) {
      plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar5;
    }
    plVar2->parent_color =
         (ulong)((uint)plVar2->parent_color & 3) | plVar5->parent_color & 0xfffffffffffffffc;
    plVar8 = rbt;
    if (rbt->root != plVar5) {
      plVar10 = (lgx_rb_t *)(plVar5->parent_color & 0xfffffffffffffffc);
      plVar8 = (lgx_rb_t *)&plVar10->size;
      if (*(lgx_rb_node_s **)&plVar10->size != plVar5) {
        plVar8 = plVar10;
      }
    }
    plVar8->root = plVar2;
    plVar2->right = plVar5;
    plVar5->parent_color = (ulong)((uint)plVar5->parent_color & 3) | (ulong)plVar2;
    plVar6 = node;
    node = plVar5;
  }
  *(byte *)&plVar6->parent_color = (byte)plVar6->parent_color | 1;
  *(byte *)&plVar4->parent_color = (byte)plVar4->parent_color & 0xfe;
  plVar5 = plVar4->right;
  plVar6 = plVar5->left;
  plVar4->right = plVar6;
  if (plVar6 != (lgx_rb_node_s *)0x0) {
    plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar4;
  }
  plVar5->parent_color =
       (ulong)((uint)plVar5->parent_color & 3) | plVar4->parent_color & 0xfffffffffffffffc;
  plVar8 = rbt;
  if (rbt->root != plVar4) {
    puVar7 = (ulong *)(plVar4->parent_color & 0xfffffffffffffffc);
    plVar8 = (lgx_rb_t *)(puVar7 + ((lgx_rb_node_t *)*puVar7 != plVar4));
  }
  plVar8->root = plVar5;
  plVar6 = plVar5;
  goto LAB_0011180d;
LAB_00111704:
  plVar6 = plVar4->right;
  bVar3 = true;
  if ((plVar6 != (lgx_rb_node_s *)0x0) && ((plVar6->parent_color & 1) == 0)) {
    plVar6->parent_color = plVar6->parent_color | 1;
    *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color | 1;
    *(byte *)&plVar4->parent_color = (byte)plVar4->parent_color & 0xfe;
    bVar3 = false;
    node = plVar4;
  }
  if (bVar3) {
    plVar6 = plVar5->right;
    plVar9 = plVar5;
    if (plVar6 == node) {
      plVar9 = plVar6->left;
      plVar5->right = plVar9;
      if (plVar9 != (lgx_rb_node_s *)0x0) {
        plVar9->parent_color = (ulong)((uint)plVar9->parent_color & 3) | (ulong)plVar5;
      }
      plVar6->parent_color =
           (ulong)((uint)plVar6->parent_color & 3) | plVar5->parent_color & 0xfffffffffffffffc;
      plVar8 = rbt;
      if (rbt->root != plVar5) {
        puVar7 = (ulong *)(plVar5->parent_color & 0xfffffffffffffffc);
        plVar8 = (lgx_rb_t *)(puVar7 + ((lgx_rb_node_s *)*puVar7 != plVar5));
      }
      plVar8->root = plVar6;
      plVar6->left = plVar5;
      plVar5->parent_color = (ulong)((uint)plVar5->parent_color & 3) | (ulong)plVar6;
      plVar9 = node;
      node = plVar5;
    }
    *(byte *)&plVar9->parent_color = (byte)plVar9->parent_color | 1;
    *(byte *)&plVar4->parent_color = (byte)plVar4->parent_color & 0xfe;
    plVar5 = plVar4->left;
    plVar6 = plVar5->right;
    plVar4->left = plVar6;
    if (plVar6 != (lgx_rb_node_s *)0x0) {
      plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar4;
    }
    plVar5->parent_color =
         (ulong)((uint)plVar5->parent_color & 3) | plVar4->parent_color & 0xfffffffffffffffc;
    plVar8 = rbt;
    if (rbt->root != plVar4) {
      plVar10 = (lgx_rb_t *)(plVar4->parent_color & 0xfffffffffffffffc);
      plVar8 = (lgx_rb_t *)&plVar10->size;
      if (*(lgx_rb_node_t **)&plVar10->size != plVar4) {
        plVar8 = plVar10;
      }
    }
    plVar6 = (lgx_rb_node_s *)&plVar5->right;
    plVar8->root = plVar5;
LAB_0011180d:
    plVar6->left = plVar4;
    plVar4->parent_color = (ulong)((uint)plVar4->parent_color & 3) | (ulong)plVar5;
  }
  goto LAB_001115d4;
}

Assistant:

void rb_insert_fixup(lgx_rb_t *rbt, lgx_rb_node_t *node) {  
    lgx_rb_node_t *parent, *gparent;  
  
    while ((parent = rb_parent(node)) && rb_is_red(parent)) {
        gparent = rb_parent(parent); 
  
        if (parent == gparent->left) {  
            {
                register lgx_rb_node_t *uncle = gparent->right; 
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);
                    rb_set_black(parent);
                    rb_set_red(gparent);
                    node = gparent;
                    continue;
                }  
            }
  
            if (parent->right == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_left(rbt, parent);
                tmp = parent;
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);
            rb_set_red(gparent);
            rb_rotate_right(rbt, gparent);
        } else {
            {
                register lgx_rb_node_t *uncle = gparent->left;  
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);  
                    rb_set_black(parent);  
                    rb_set_red(gparent);  
                    node = gparent;  
                    continue;  
                }
            }
  
            if (parent->left == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_right(rbt, parent);  
                tmp = parent;  
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);  
            rb_set_red(gparent);  
            rb_rotate_left(rbt, gparent);  
        }
    }
  
    rb_set_black(rbt->root);  
}